

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommandLIST(FtpSession *this,string *param)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  FileType FVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  string path2dst;
  string local_path;
  FileStatus dir_status;
  undefined1 local_198 [48];
  string local_168;
  string local_148;
  FileStatus local_128;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  peVar3 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 == (element_type *)0x0) {
    local_128.path_._M_dataplus._M_p = (pointer)&local_128.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,&local_128.path_);
  }
  else {
    if ((peVar3->permissions_ & DirList) != None) {
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      iVar5 = ::std::__cxx11::string::compare((char *)param);
      if ((((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)param), iVar5 == 0)) ||
          (iVar5 = ::std::__cxx11::string::compare((char *)param), iVar5 == 0)) ||
         (iVar5 = ::std::__cxx11::string::compare((char *)param), iVar5 == 0)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_168,0,(char *)local_168._M_string_length,0x13898f);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_128,(ulong)param);
        iVar5 = ::std::__cxx11::string::compare((char *)&local_128);
        bVar4 = iVar5 != 0;
        if (iVar5 == 0) {
LAB_00118704:
          bVar8 = 3 < param->_M_string_length;
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_50,(ulong)param);
          iVar5 = ::std::__cxx11::string::compare((char *)local_50);
          if (iVar5 == 0) goto LAB_00118704;
          bVar4 = true;
          bVar8 = false;
        }
        if ((bVar4) && (local_50[0] != local_40)) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        paVar2 = &local_128.path_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.path_._M_dataplus._M_p != paVar2) {
          operator_delete(local_128.path_._M_dataplus._M_p,
                          local_128.path_.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)param);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)param);
          iVar5 = ::std::__cxx11::string::compare((char *)&local_128);
          bVar4 = iVar5 != 0;
          if (iVar5 == 0) {
LAB_001187db:
            bVar8 = 4 < param->_M_string_length;
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_70,(ulong)param);
            iVar5 = ::std::__cxx11::string::compare((char *)local_70);
            if (iVar5 == 0) goto LAB_001187db;
            bVar4 = true;
            bVar8 = false;
          }
          if ((bVar4) && (local_70[0] != local_60)) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.path_._M_dataplus._M_p != paVar2) {
            operator_delete(local_128.path_._M_dataplus._M_p,
                            local_128.path_.field_2._M_allocated_capacity + 1);
          }
          if (!bVar8) {
            ::std::__cxx11::string::_M_assign((string *)&local_168);
            goto LAB_00118552;
          }
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)param);
        }
        ::std::__cxx11::string::operator=((string *)&local_168,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.path_._M_dataplus._M_p != paVar2) {
          operator_delete(local_128.path_._M_dataplus._M_p,
                          local_128.path_.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00118552:
      toLocalPath(&local_148,this,&local_168);
      Filesystem::FileStatus::FileStatus(&local_128,(string *)&local_148);
      bVar4 = Filesystem::FileStatus::isOk(&local_128);
      if (bVar4) {
        FVar6 = Filesystem::FileStatus::type(&local_128);
        if (FVar6 != Dir) {
          local_198._0_8_ = local_198 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Path is not a directory","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_198);
          goto LAB_001186a0;
        }
        bVar4 = Filesystem::FileStatus::canOpenDir(&local_128);
        pcVar1 = local_198 + 0x10;
        local_198._0_8_ = pcVar1;
        if (!bVar4) {
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Permission denied","");
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_198);
          goto LAB_001186a0;
        }
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"Sending directory listing","");
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)local_198);
        if ((pointer)local_198._0_8_ != pcVar1) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
        }
        Filesystem::dirContent
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)local_198,(string *)&local_148);
        sendDirectoryListing
                  (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                         *)local_198);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                     *)local_198);
      }
      else {
        local_198._0_8_ = local_198 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"Path does not exist","");
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)local_198);
LAB_001186a0:
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
        }
      }
      Filesystem::FileStatus::~FileStatus(&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p == &local_168.field_2) {
        return;
      }
      local_128.path_.field_2._M_allocated_capacity =
           CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,local_168.field_2._M_local_buf[0])
      ;
      _Var7._M_p = local_168._M_dataplus._M_p;
      goto LAB_001186ea;
    }
    local_128.path_._M_dataplus._M_p = (pointer)&local_128.path_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Permission denied","");
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_128.path_);
  }
  _Var7._M_p = local_128.path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.path_._M_dataplus._M_p == &local_128.path_.field_2) {
    return;
  }
LAB_001186ea:
  operator_delete(_Var7._M_p,local_128.path_.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandLIST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    // Deal with some unusual commands like "LIST -a", "LIST -a dirname".
    // Some FTP clients send those commands, as if they would call ls on unix.
    // 
    // We try to support those parameters (or rather ignore them), even though
    // this techniqually breaks listing directories that actually use "-a" etc.
    // as directory name. As most clients however first CWD into a directory and
    // call LIST without parameter afterwards and starting a directory name with
    // "-a " / "-l " / "-al " / "-la " is not that common, the compatibility
    // benefit should outperform te potential problems by a lot.
    // 
    // The RFC-violating LIST command now shall be:
    // 
    //   LIST [<SP> <arg>] [<SP> <pathname>] <CRLF>
    // 
    //   with:
    // 
    //     <arg> ::= -a
    //             | -l
    //             | -al
    //             | -la
    //

    std::string path2dst;
    if ((param == "-a") || (param == "-l") || (param == "-al") || (param == "-la"))
    {
      path2dst  = "";
    }
    else if ((param.substr(0, 3)=="-a "|| param.substr(0, 3)=="-l ") && (param.size() > 3))
    {
      path2dst = param.substr(3);
    }
    else if ((param.substr(0, 4) == "-al " || param.substr(0, 4) == "-la ") && (param.size() > 4))
    {
      path2dst = param.substr(4);
    }
    else
    {
      path2dst = param;
    }

    std::string local_path = toLocalPath(path2dst);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending directory listing");
          sendDirectoryListing(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }